

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  byte bVar1;
  byte bVar2;
  int *__s;
  char *__s_00;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  byte *z;
  char *pcVar7;
  sqlite3_vtab *psVar8;
  long lVar9;
  void *__dest;
  long in_FS_OFFSET;
  bool bVar10;
  int rc;
  int rc_1;
  char *azSchema [3];
  int local_60;
  int local_5c;
  char *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = "CREATE TABlE vocab(term, col, doc, cnt)";
  local_58[1] = "CREATE TABlE vocab(term, doc, cnt)";
  local_58[2] = "CREATE TABlE vocab(term, doc, col, offset)";
  local_60 = 0;
  if (argc == 6) {
    __s = (int *)argv[1];
    sVar4 = strlen((char *)__s);
    if (sVar4 != 4) goto LAB_001f7281;
    bVar10 = *__s == 0x706d6574;
  }
  else {
LAB_001f7281:
    bVar10 = false;
  }
  if ((argc != 5) && (bVar10 == false)) {
    psVar8 = (sqlite3_vtab *)0x0;
    pcVar5 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar5;
    local_60 = 1;
    goto LAB_001f74e1;
  }
  pcVar5 = argv[(ulong)bVar10 + 3];
  pcVar7 = argv[(ulong)bVar10 + 4];
  __s_00 = argv[(ulong)bVar10 * 2 + 1];
  sVar4 = strlen(__s_00);
  sVar6 = strlen(pcVar5);
  local_5c = 0;
  z = (byte *)sqlite3Fts5Strndup(&local_5c,pcVar7,-1);
  lVar9 = 0;
  if (local_5c == 0) {
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    lVar9 = 0;
    do {
      bVar1 = z[lVar9];
      bVar2 = "ncol"[lVar9 + 1];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001f736c;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001f736c;
      lVar9 = lVar9 + 1;
    } while( true );
  }
  goto LAB_001f740e;
LAB_001f736c:
  lVar9 = 0;
  if (bVar1 != bVar2) {
    lVar9 = 0;
    do {
      bVar1 = z[lVar9];
      bVar2 = "Unable to fetch row"[lVar9 + 0x10];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001f73a5;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001f73a5;
      lVar9 = lVar9 + 1;
    } while( true );
  }
  goto LAB_001f7406;
LAB_001f73dd:
  lVar9 = 2;
  if (bVar1 != bVar2) {
    lVar9 = 0;
    pcVar7 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",z);
    *pzErr = pcVar7;
    local_5c = 1;
  }
  goto LAB_001f7406;
LAB_001f73a5:
  lVar9 = 1;
  if (bVar1 != bVar2) {
    lVar9 = 0;
    do {
      bVar1 = z[lVar9];
      bVar2 = "instance"[lVar9];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001f73dd;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001f73dd;
      lVar9 = lVar9 + 1;
    } while( true );
  }
LAB_001f7406:
  sqlite3_free(z);
LAB_001f740e:
  local_60 = local_5c;
  if (local_5c == 0) {
    local_60 = sqlite3_declare_vtab(db,local_58[lVar9]);
  }
  psVar8 = (sqlite3_vtab *)sqlite3Fts5MallocZero(&local_60,(long)((int)sVar4 + (int)sVar6 + 0x42));
  if (psVar8 != (sqlite3_vtab *)0x0) {
    sVar6 = (size_t)((int)sVar6 + 1);
    psVar8[2].pModule = (sqlite3_module *)pAux;
    psVar8[2].nRef = (int)lVar9;
    psVar8[1].zErrMsg = (char *)db;
    psVar8[1].pModule = (sqlite3_module *)&psVar8[2].zErrMsg;
    __dest = (void *)((long)&psVar8[2].zErrMsg + sVar6);
    *(void **)&psVar8[1].nRef = __dest;
    memcpy(&psVar8[2].zErrMsg,pcVar5,sVar6);
    memcpy(__dest,__s_00,(long)((int)sVar4 + 1));
    uVar3 = (byte)(psVar8[1].pModule)->iVersion - 0x22;
    if ((uVar3 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)psVar8[1].pModule);
    }
    uVar3 = **(byte **)&psVar8[1].nRef - 0x22;
    if ((uVar3 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)*(byte **)&psVar8[1].nRef);
    }
  }
LAB_001f74e1:
  *ppVTab = psVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_60;
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = {
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1;
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;

    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}